

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspa.c
# Opt level: O0

void aspa_table_update_in_place_cleanup(aspa_update_operation **operations,size_t count)

{
  long lVar1;
  aspa_update_operation *paVar2;
  long in_FS_OFFSET;
  aspa_update_operation *op;
  size_t i;
  size_t count_local;
  aspa_update_operation **operations_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((operations != (aspa_update_operation **)0x0) && (*operations != (aspa_update_operation *)0x0)
     ) {
    for (op = (aspa_update_operation *)0x0; op < count;
        op = (aspa_update_operation *)((long)&op->index + 1)) {
      paVar2 = *operations;
      if (((paVar2[(long)op].is_no_op & 1U) == 0) && (paVar2[(long)op].type == ASPA_REMOVE)) {
        if (paVar2[(long)op].record.provider_asns != (uint32_t *)0x0) {
          lrtr_free(paVar2[(long)op].record.provider_asns);
        }
        paVar2[(long)op].record.provider_asns = (uint32_t *)0x0;
        paVar2[(long)op].record.provider_count = 0;
      }
    }
    lrtr_free(*operations);
    *operations = (aspa_update_operation *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void aspa_table_update_in_place_cleanup(struct aspa_update_operation **operations, size_t count)
{
	if (!operations || !*operations)
		return;

	// If count == 0, this won't be executed
	for (size_t i = 0; i < count; i++) {
		struct aspa_update_operation *op = &(*operations)[i];

		// If it's a remove operation, we inserted a reference to the removed record's providers.
		// Release that provider array now and restore that 'remove'
		// operation back to its original state.
		if (!op->is_no_op && op->type == ASPA_REMOVE) {
			if (op->record.provider_asns)
				lrtr_free(op->record.provider_asns);

			op->record.provider_asns = NULL;
			op->record.provider_count = 0;
		}
	}

	lrtr_free(*operations);
	*operations = NULL;
}